

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O0

void __thiscall ItemTable::GreenRoomOne(ItemTable *this)

{
  ItemWrapper *pIVar1;
  ItemWrapper *pIVar2;
  mapped_type *ppIVar3;
  key_type local_244 [6];
  undefined1 local_22a;
  allocator local_229;
  string local_228 [32];
  Item local_208;
  ItemWrapper *local_1e0;
  ItemWrapper *boat;
  string local_1d0 [32];
  Item local_1b0;
  ItemWrapper *local_188;
  ItemWrapper *gRoomOne;
  string local_178 [32];
  Item local_158;
  ItemWrapper *local_130;
  ItemWrapper *gRoomTokenDoor;
  string local_120 [32];
  Item local_100;
  ItemWrapper *local_d8;
  ItemWrapper *gooseToken;
  string local_c8 [32];
  Item local_a8;
  ItemWrapper *local_80;
  ItemWrapper *beanToken;
  allocator local_61;
  string local_60 [32];
  Item local_40;
  ItemWrapper *local_18;
  ItemWrapper *foxToken;
  ItemTable *this_local;
  
  foxToken = (ItemWrapper *)this;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  beanToken._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Fox Token",&local_61);
  Item::Item(&local_40,(string *)local_60,FOX_TOKEN);
  ItemWrapper::ItemWrapper(pIVar2,&local_40,G_ROOM1_SIDE1);
  beanToken._3_1_ = 0;
  Item::~Item(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_18 = pIVar2;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  gooseToken._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"Bean Token",(allocator *)((long)&gooseToken + 7));
  Item::Item(&local_a8,(string *)local_c8,BEAN_TOKEN);
  ItemWrapper::ItemWrapper(pIVar2,&local_a8,G_ROOM1_SIDE1);
  gooseToken._6_1_ = 0;
  Item::~Item(&local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gooseToken + 7));
  local_80 = pIVar2;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  gRoomTokenDoor._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"Goose Token",(allocator *)((long)&gRoomTokenDoor + 7));
  Item::Item(&local_100,(string *)local_120,GOOSE_TOKEN);
  ItemWrapper::ItemWrapper(pIVar2,&local_100,G_ROOM1_SIDE1);
  gRoomTokenDoor._6_1_ = 0;
  Item::~Item(&local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gRoomTokenDoor + 7));
  local_d8 = pIVar2;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  gRoomOne._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"Token Door",(allocator *)((long)&gRoomOne + 7));
  Item::Item(&local_158,(string *)local_178,TOKEN_DOOR);
  ItemWrapper::ItemWrapper(pIVar2,&local_158,HIDDEN);
  gRoomOne._6_1_ = 0;
  Item::~Item(&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gRoomOne + 7));
  local_130 = pIVar2;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  boat._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"GreenRoomOne",(allocator *)((long)&boat + 7));
  Item::Item(&local_1b0,(string *)local_1d0,G_ROOM_STATE);
  ItemWrapper::ItemWrapper(pIVar2,&local_1b0,NOT_WON);
  boat._6_1_ = 0;
  Item::~Item(&local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&boat + 7));
  local_188 = pIVar2;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  local_22a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"old Boat",&local_229);
  Item::Item(&local_208,(string *)local_228,G_BOAT);
  ItemWrapper::ItemWrapper(pIVar2,&local_208,G_ROOM1_SIDE1);
  local_22a = 0;
  Item::~Item(&local_208);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  pIVar1 = local_18;
  local_244[5] = 9;
  local_1e0 = pIVar2;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_244 + 5);
  pIVar2 = local_80;
  *ppIVar3 = pIVar1;
  local_244[4] = 10;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_244 + 4);
  pIVar1 = local_d8;
  *ppIVar3 = pIVar2;
  local_244[3] = 0xc;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_244 + 3);
  pIVar2 = local_130;
  *ppIVar3 = pIVar1;
  local_244[2] = 0xd;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_244 + 2);
  pIVar1 = local_188;
  *ppIVar3 = pIVar2;
  local_244[1] = 0xe;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_244 + 1);
  pIVar2 = local_1e0;
  *ppIVar3 = pIVar1;
  local_244[0] = G_BOAT;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_244);
  *ppIVar3 = pIVar2;
  return;
}

Assistant:

void ItemTable::GreenRoomOne(){

    ItemWrapper *       foxToken = new ItemWrapper(Item("Fox Token", FOX_TOKEN), G_ROOM1_SIDE1);
    ItemWrapper *      beanToken = new ItemWrapper(Item("Bean Token", BEAN_TOKEN), G_ROOM1_SIDE1);
    ItemWrapper *     gooseToken = new ItemWrapper(Item("Goose Token", GOOSE_TOKEN), G_ROOM1_SIDE1);
    ItemWrapper * gRoomTokenDoor = new ItemWrapper(Item("Token Door", TOKEN_DOOR), HIDDEN);
    ItemWrapper * gRoomOne       = new ItemWrapper(Item("GreenRoomOne", G_ROOM_STATE), NOT_WON);
    ItemWrapper * boat = new ItemWrapper(Item("old Boat", G_BOAT), G_ROOM1_SIDE1);

    items[FOX_TOKEN]   = foxToken;
    items[BEAN_TOKEN]  = beanToken;
    items[GOOSE_TOKEN] = gooseToken;
    items[TOKEN_DOOR]  = gRoomTokenDoor;
    items[G_ROOM_STATE] = gRoomOne;
    items[G_BOAT] = boat;
}